

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O0

void __thiscall
sglr::GLContext::blitFramebuffer
          (GLContext *this,int srcX0,int srcY0,int srcX1,int srcY1,int dstX0,int dstY0,int dstX1,
          int dstY1,deUint32 mask,deUint32 filter)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  MessageBuilder *pMVar8;
  undefined4 extraout_var;
  int *piVar9;
  int iVar10;
  Enum<int,_2UL> EVar11;
  Enum<int,_2UL> local_200;
  Bitfield<16UL> local_1f0;
  MessageBuilder local_1c8;
  undefined1 local_44 [8];
  IVec2 readOffset;
  IVec2 drawOffset;
  int dstX0_local;
  int srcY1_local;
  int srcX1_local;
  int srcY0_local;
  int srcX0_local;
  GLContext *this_local;
  
  drawOffset.m_data[0] = dstX0;
  drawOffset.m_data[1] = srcY1;
  dstX0_local = srcX1;
  srcY1_local = srcY0;
  srcX1_local = srcX0;
  _srcY0_local = this;
  getDrawOffset((GLContext *)&readOffset);
  getReadOffset((GLContext *)local_44);
  if ((this->m_logFlags & 1) != 0) {
    tcu::TestLog::operator<<(&local_1c8,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<(&local_1c8,(char (*) [19])"glBlitFramebuffer(");
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&srcX1_local);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x12ed2ef);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&srcY1_local);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x12ed2ef);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&dstX0_local);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x12ed2ef);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,drawOffset.m_data + 1);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x12ed2ef);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,drawOffset.m_data);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x12ed2ef);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&dstY0);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x12ed2ef);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&dstX1);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x12ed2ef);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&dstY1);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x12ed2ef);
    glu::getBufferMaskStr(&local_1f0,mask);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_1f0);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x12ed2ef);
    EVar11 = glu::getTextureFilterStr(filter);
    local_200.m_getName = EVar11.m_getName;
    local_200.m_value = EVar11.m_value;
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_200);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x130f08e);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c8);
  }
  iVar2 = (*this->m_context->_vptr_RenderContext[3])();
  pcVar1 = *(code **)(CONCAT44(extraout_var,iVar2) + 0x140);
  piVar9 = tcu::Vector<int,_2>::x((Vector<int,_2> *)local_44);
  iVar2 = *piVar9 + srcX1_local;
  piVar9 = tcu::Vector<int,_2>::y((Vector<int,_2> *)local_44);
  iVar3 = *piVar9 + srcY1_local;
  piVar9 = tcu::Vector<int,_2>::x((Vector<int,_2> *)local_44);
  iVar4 = *piVar9 + dstX0_local;
  piVar9 = tcu::Vector<int,_2>::y((Vector<int,_2> *)local_44);
  iVar5 = *piVar9 + drawOffset.m_data[1];
  piVar9 = tcu::Vector<int,_2>::x(&readOffset);
  iVar6 = *piVar9 + drawOffset.m_data[0];
  piVar9 = tcu::Vector<int,_2>::y(&readOffset);
  iVar7 = *piVar9 + dstY0;
  piVar9 = tcu::Vector<int,_2>::x(&readOffset);
  iVar10 = *piVar9 + dstX1;
  piVar9 = tcu::Vector<int,_2>::y(&readOffset);
  (*pcVar1)(iVar2,iVar3,iVar4,iVar5,iVar6,iVar7,iVar10,*piVar9 + dstY1,mask,filter);
  return;
}

Assistant:

void GLContext::blitFramebuffer (int srcX0, int srcY0, int srcX1, int srcY1, int dstX0, int dstY0, int dstX1, int dstY1, deUint32 mask, deUint32 filter)
{
	tcu::IVec2	drawOffset	= getDrawOffset();
	tcu::IVec2	readOffset	= getReadOffset();

	if ((m_logFlags & GLCONTEXT_LOG_CALLS) != 0)
		m_log << TestLog::Message << "glBlitFramebuffer("
								  << srcX0 << ", " << srcY0 << ", " << srcX1 << ", " << srcY1 << ", "
								  << dstX0 << ", " << dstY0 << ", " << dstX1 << ", " << dstY1 << ", "
								  << glu::getBufferMaskStr(mask) << ", "
								  << glu::getTextureFilterStr(filter) << ")"
			  << TestLog::EndMessage;

	m_context.getFunctions().blitFramebuffer(readOffset.x()+srcX0, readOffset.y()+srcY0, readOffset.x()+srcX1, readOffset.y()+srcY1,
											 drawOffset.x()+dstX0, drawOffset.y()+dstY0, drawOffset.x()+dstX1, drawOffset.y()+dstY1,
											 mask, filter);
}